

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O2

void pcap_freealldevs(pcap_if_t *alldevs)

{
  pcap_if *ppVar1;
  pcap_addr *ppVar2;
  pcap_addr *__ptr;
  
  while (alldevs != (pcap_if_t *)0x0) {
    ppVar1 = alldevs->next;
    __ptr = alldevs->addresses;
    while (__ptr != (pcap_addr *)0x0) {
      ppVar2 = __ptr->next;
      free(__ptr->addr);
      free(__ptr->netmask);
      free(__ptr->broadaddr);
      free(__ptr->dstaddr);
      free(__ptr);
      __ptr = ppVar2;
    }
    free(alldevs->name);
    free(alldevs->description);
    free(alldevs);
    alldevs = ppVar1;
  }
  return;
}

Assistant:

void
pcap_freealldevs(pcap_if_t *alldevs)
{
	pcap_if_t *curdev, *nextdev;
	pcap_addr_t *curaddr, *nextaddr;

	for (curdev = alldevs; curdev != NULL; curdev = nextdev) {
		nextdev = curdev->next;

		/*
		 * Free all addresses.
		 */
		for (curaddr = curdev->addresses; curaddr != NULL; curaddr = nextaddr) {
			nextaddr = curaddr->next;
			if (curaddr->addr)
				free(curaddr->addr);
			if (curaddr->netmask)
				free(curaddr->netmask);
			if (curaddr->broadaddr)
				free(curaddr->broadaddr);
			if (curaddr->dstaddr)
				free(curaddr->dstaddr);
			free(curaddr);
		}

		/*
		 * Free the name string.
		 */
		free(curdev->name);

		/*
		 * Free the description string, if any.
		 */
		if (curdev->description != NULL)
			free(curdev->description);

		/*
		 * Free the interface.
		 */
		free(curdev);
	}
}